

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  char *__s;
  _Bit_type *p_Var2;
  _Bit_pointer puVar3;
  int iVar4;
  int rounds;
  int sweepLimit;
  int timeout;
  int sweepRate;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  istream *piVar8;
  long lVar9;
  invalid_argument *this;
  ulong uVar10;
  bool correlatedErrors;
  bool greedy;
  allocator local_401;
  vector<bool,_std::allocator<bool>_> local_400;
  string latticeType;
  string local_3b8;
  long local_398;
  double local_390;
  double local_388;
  string local_380;
  string sweepSchedule;
  stringstream ssc;
  long local_330;
  uint auStack_328 [26];
  ios_base local_2c0 [264];
  stringstream ssg;
  uint auStack_1a0 [26];
  ios_base local_138 [264];
  
  if (argc < 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Fewer than eleven arguments",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    iVar4 = 1;
    if (0 < argc) {
      uVar10 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Argument ",9);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        __s = argv[uVar10];
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        uVar10 = uVar10 + 1;
      } while ((uint)argc != uVar10);
      iVar4 = 1;
    }
  }
  else {
    iVar4 = atoi(argv[1]);
    local_388 = atof(argv[2]);
    local_390 = atof(argv[3]);
    rounds = atoi(argv[4]);
    std::__cxx11::string::string((string *)&latticeType,argv[5],(allocator *)&ssg);
    sweepLimit = atoi(argv[6]);
    std::__cxx11::string::string((string *)&sweepSchedule,argv[7],(allocator *)&ssg);
    timeout = atoi(argv[8]);
    std::__cxx11::string::string((string *)&ssc,argv[9],(allocator *)&local_400);
    std::__cxx11::stringstream::stringstream((stringstream *)&ssg,(string *)&ssc,_S_out|_S_in);
    if (_ssc != &local_330) {
      operator_delete(_ssc,local_330 + 1);
    }
    puVar1 = (uint *)((long)auStack_1a0 + *(long *)(_ssg + -0x18));
    *puVar1 = *puVar1 | 1;
    piVar8 = std::istream::_M_extract<bool>((bool *)&ssg);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::string::string((string *)&local_400,argv[10],&local_401);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&ssc,(string *)&local_400,_S_out|_S_in);
      if ((_Bit_iterator *)
          local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
      }
      *(uint *)((long)auStack_328 + _ssc[-3]) = *(uint *)((long)auStack_328 + _ssc[-3]) | 1;
      piVar8 = std::istream::_M_extract<bool>((bool *)&ssc);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        sweepRate = atoi(argv[0xb]);
        lVar9 = std::chrono::_V2::system_clock::now();
        iVar5 = std::__cxx11::string::compare((char *)&latticeType);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&latticeType);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)&latticeType);
            if (iVar5 != 0) {
              iVar5 = std::__cxx11::string::compare((char *)&latticeType);
              if (iVar5 != 0) {
                this = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(this,"Invalid lattice type.");
                __cxa_throw(this,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
            }
          }
        }
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        local_398 = lVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,sweepSchedule._M_dataplus._M_p,
                   sweepSchedule._M_dataplus._M_p + sweepSchedule._M_string_length);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,latticeType._M_dataplus._M_p,
                   latticeType._M_dataplus._M_p + latticeType._M_string_length);
        oneRun(&local_400,iVar4,rounds,local_388,local_390,sweepLimit,&local_3b8,timeout,&local_380,
               greedy,correlatedErrors,sweepRate);
        puVar3 = local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
        p_Var2 = local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_400.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        lVar9 = std::chrono::_V2::system_clock::now();
        poVar6 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::ostream::_M_insert<double>((double)(lVar9 - local_398) / 1000000000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        operator_delete(p_Var2,(long)puVar3 - (long)p_Var2);
        iVar4 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Incorrect argument provided (boolean).",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        iVar4 = 1;
        std::ostream::flush();
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ssc);
      std::ios_base::~ios_base(local_2c0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incorrect argument provided (boolean).",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
      std::ostream::put(-0x70);
      iVar4 = 1;
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ssg);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sweepSchedule._M_dataplus._M_p != &sweepSchedule.field_2) {
      operator_delete(sweepSchedule._M_dataplus._M_p,sweepSchedule.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)latticeType._M_dataplus._M_p != &latticeType.field_2) {
      operator_delete(latticeType._M_dataplus._M_p,latticeType.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 11)
    {
        std::cout << "Fewer than eleven arguments" << std::endl;
        for (int i = 0; i < argc; ++i)
        {
            std::cout << "Argument " << i << " = " << argv[i] << std::endl;
        }
        return 1;
    }

    int l = std::atoi(argv[1]);
    double p = std::atof(argv[2]);
    double q = std::atof(argv[3]);
    // std::string sweepDir(argv[4]);
    int rounds = std::atoi(argv[4]);
    std::string latticeType(argv[5]);
    int sweepLimit = std::atoi(argv[6]);
    std::string sweepSchedule(argv[7]);
    int timeout = std::atoi(argv[8]);
    bool greedy;
    std::stringstream ssg(argv[9]);
    if (!(ssg >> std::boolalpha >> greedy))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    bool correlatedErrors;
    std::stringstream ssc(argv[10]);
    if (!(ssc >> std::boolalpha >> correlatedErrors))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    std::vector<bool> succ;
    int sweepRate = std::atoi(argv[11]);

    auto start = std::chrono::high_resolution_clock::now();
    // if (latticeType == "rhombic_toric")
    // {
    //     succ = runToric(l, rounds, p, q, sweepDir, timeout, greedy, correlatedErrors);
    // }
    // else if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries")
    if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries" || latticeType == "rhombic_toric" || latticeType == "cubic_toric")
    {
        // succ = runBoundaries(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors);
        succ = oneRun(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors, sweepRate);
    }
    else
    {
        throw std::invalid_argument("Invalid lattice type.");
    }
    auto finish = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed = finish - start;

    std::cout << succ[0] << ", " // Decoding succeeded
              << succ[1] << ", " // Clean syndrome
              << elapsed.count() // "s" <<
              << std::endl;

    return 0;
}